

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax> *args_3;
  TypeParameterDeclarationSyntax *pTVar1;
  DeepCloneVisitor visitor;
  ForwardTypeRestrictionSyntax *local_40;
  Token local_38;
  Token local_28;
  
  local_28 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x38) == (SyntaxNode *)0x0) {
    local_40 = (ForwardTypeRestrictionSyntax *)0x0;
  }
  else {
    local_40 = (ForwardTypeRestrictionSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x38),(DeepCloneVisitor *)&local_40,
                          (BumpAllocator *)__child_stack);
  }
  args_3 = deepClone<slang::syntax::TypeAssignmentSyntax>
                     ((SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax> *)(__fn + 0x40),
                      (BumpAllocator *)__child_stack);
  pTVar1 = BumpAllocator::
           emplace<slang::syntax::TypeParameterDeclarationSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ForwardTypeRestrictionSyntax*,slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>&>
                     ((BumpAllocator *)__child_stack,&local_28,&local_38,&local_40,args_3);
  return (int)pTVar1;
}

Assistant:

static SyntaxNode* clone(const TypeParameterDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<TypeParameterDeclarationSyntax>(
        node.keyword.deepClone(alloc),
        node.typeKeyword.deepClone(alloc),
        node.typeRestriction ? deepClone(*node.typeRestriction, alloc) : nullptr,
        *deepClone(node.declarators, alloc)
    );
}